

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::OriginPubkeyProvider::OriginString_abi_cxx11_
          (OriginPubkeyProvider *this,StringType type,bool normalized)

{
  long lVar1;
  undefined1 in_CL;
  undefined4 in_EDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  bool use_apostrophe;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  bool local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  uint uVar2;
  undefined1 apostrophe;
  Span<const_unsigned_char> in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  apostrophe = (undefined1)((uint)in_EDX >> 0x18);
  uVar2 = CONCAT31((int3)in_EDX,in_CL) & 0xffffff01;
  if (((char)uVar2 != '\0') ||
     (local_99 = true,
     ((ulong)in_RSI[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish & 1) == 0)) {
    local_99 = CONCAT13(apostrophe,(int3)(uVar2 >> 8)) == 1;
  }
  Span<const_unsigned_char>::Span<4>
            ((Span<const_unsigned_char> *)in_stack_ffffffffffffff58,(uchar (*) [4])0x6fd466);
  HexStr_abi_cxx11_(in_stack_ffffffffffffffe0);
  FormatHDKeypath_abi_cxx11_(in_RSI,(bool)apostrophe);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(apostrophe,CONCAT43(uVar2,CONCAT12(local_99,in_stack_ffffffffffffff90))),
                 in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string OriginString(StringType type, bool normalized=false) const
    {
        // If StringType==COMPAT, always use the apostrophe to stay compatible with previous versions
        bool use_apostrophe = (!normalized && m_apostrophe) || type == StringType::COMPAT;
        return HexStr(m_origin.fingerprint) + FormatHDKeypath(m_origin.path, use_apostrophe);
    }